

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

void __thiscall
cmConditionEvaluator::cmArgumentList::CurrentAndTwoMoreIter::CurrentAndTwoMoreIter
          (CurrentAndTwoMoreIter *this,base_t *args)

{
  bool bVar1;
  iterator iVar2;
  _List_iterator<cmExpandedCommandArgument> _Var3;
  _Self local_38;
  _List_iterator<cmExpandedCommandArgument> local_30;
  _Self local_28;
  _List_iterator<cmExpandedCommandArgument> local_20;
  list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *local_18;
  base_t *args_local;
  CurrentAndTwoMoreIter *this_local;
  
  local_18 = args;
  args_local = (base_t *)this;
  iVar2 = std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
          ::begin(args);
  (this->current)._M_node = iVar2._M_node;
  local_20._M_node = (this->current)._M_node;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
       end(local_18);
  bVar1 = std::operator!=(&this->current,&local_28);
  _Var3 = std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_20,(ulong)bVar1);
  (this->next)._M_node = _Var3._M_node;
  local_30._M_node = (this->next)._M_node;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
       end(local_18);
  bVar1 = std::operator!=(&this->next,&local_38);
  _Var3 = std::next<std::_List_iterator<cmExpandedCommandArgument>>(local_30,(ulong)bVar1);
  (this->nextnext)._M_node = _Var3._M_node;
  return;
}

Assistant:

CurrentAndTwoMoreIter(base_t& args)
      : current(args.begin())
      , next(
          std::next(this->current,
                    static_cast<difference_type>(this->current != args.end())))
      , nextnext(std::next(
          this->next, static_cast<difference_type>(this->next != args.end())))
    {
    }